

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codaeval.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined8 uVar6;
  char *definition_path;
  int i;
  int check_only;
  int perform_conversions;
  char **argv_local;
  int argc_local;
  
  i = 1;
  bVar1 = false;
  if (((argc == 1) || (iVar3 = strcmp(argv[1],"-h"), iVar3 == 0)) ||
     (iVar3 = strcmp(argv[1],"--help"), iVar3 == 0)) {
    print_help();
    exit(0);
  }
  iVar3 = strcmp(argv[1],"-v");
  if ((iVar3 == 0) || (iVar3 = strcmp(argv[1],"--version"), iVar3 == 0)) {
    print_version();
    exit(0);
  }
  definition_path._4_4_ = 1;
  if ((argc < 3) || (iVar3 = strcmp(argv[1],"-D"), iVar3 != 0)) {
    iVar3 = coda_set_definition_path_conditional(*argv,0,"../share/coda/definitions");
    pFVar2 = _stderr;
    if (iVar3 != 0) {
      puVar5 = (undefined4 *)coda_get_errno();
      uVar6 = coda_errno_to_string(*puVar5);
      fprintf(pFVar2,"ERROR: %s\n",uVar6);
      exit(1);
    }
  }
  else {
    coda_set_definition_path(argv[2]);
    definition_path._4_4_ = 3;
  }
  do {
    if (argc <= definition_path._4_4_) {
LAB_00101819:
      if (argc <= definition_path._4_4_) {
        fprintf(_stderr,"ERROR: invalid arguments\n");
        print_help();
        exit(1);
      }
      iVar3 = coda_expression_from_string(argv[definition_path._4_4_],&eval_expr);
      pFVar2 = _stderr;
      if (iVar3 != 0) {
        puVar5 = (undefined4 *)coda_get_errno();
        uVar6 = coda_errno_to_string(*puVar5);
        fprintf(pFVar2,"ERROR: error in expression: %s\n",uVar6);
        exit(1);
      }
      iVar3 = definition_path._4_4_ + 1;
      iVar4 = coda_expression_get_type(eval_expr,&expr_type);
      pFVar2 = _stderr;
      if (iVar4 != 0) {
        puVar5 = (undefined4 *)coda_get_errno();
        uVar6 = coda_errno_to_string(*puVar5);
        fprintf(pFVar2,"ERROR: %s\n",uVar6);
        exit(1);
      }
      if ((expr_type != coda_expression_node) && (expr_type != coda_expression_void)) {
        if (bVar1) {
          coda_expression_delete(eval_expr);
          if (node_expr != (coda_expression *)0x0) {
            coda_expression_delete(node_expr);
          }
        }
        else {
          if (iVar3 < argc) {
            iVar4 = coda_init();
            pFVar2 = _stderr;
            if (iVar4 != 0) {
              puVar5 = (undefined4 *)coda_get_errno();
              uVar6 = coda_errno_to_string(*puVar5);
              fprintf(pFVar2,"ERROR: %s\n",uVar6);
              exit(1);
            }
            coda_set_option_perform_conversions(i);
            iVar3 = coda_match_filefilter(0,argc - iVar3,argv + iVar3,callback);
            pFVar2 = _stderr;
            if (iVar3 != 0) {
              puVar5 = (undefined4 *)coda_get_errno();
              uVar6 = coda_errno_to_string(*puVar5);
              fprintf(pFVar2,"ERROR: %s\n",uVar6);
              exit(1);
            }
            coda_done();
          }
          else {
            if (node_expr != (coda_expression *)0x0) {
              fprintf(_stderr,
                      "ERROR: invalid arguments (path expression is only allowed if a file/directory list is provided)\n"
                     );
              exit(1);
            }
            iVar3 = coda_expression_is_constant(eval_expr);
            if (iVar3 == 0) {
              fprintf(_stderr,
                      "ERROR: invalid arguments (file/directory list needs to be provided if expression is not a constant expression)\n"
                     );
              exit(1);
            }
            iVar3 = eval_expression((coda_cursor *)0x0);
            pFVar2 = _stderr;
            if (iVar3 != 0) {
              puVar5 = (undefined4 *)coda_get_errno();
              uVar6 = coda_errno_to_string(*puVar5);
              fprintf(pFVar2,"ERROR: %s\n",uVar6);
              exit(1);
            }
          }
          coda_expression_delete(eval_expr);
          if (node_expr != (coda_expression *)0x0) {
            coda_expression_delete(node_expr);
          }
        }
        return 0;
      }
      uVar6 = coda_expression_get_type_name(expr_type);
      fprintf(pFVar2,"ERROR: expression cannot be a \'%s\' expression\n",uVar6);
      exit(1);
    }
    iVar3 = strcmp(argv[definition_path._4_4_],"-c");
    if ((iVar3 == 0) || (iVar3 = strcmp(argv[definition_path._4_4_],"--check"), iVar3 == 0)) {
      bVar1 = true;
    }
    else {
      iVar3 = strcmp(argv[definition_path._4_4_],"-d");
      if ((iVar3 == 0) ||
         (iVar3 = strcmp(argv[definition_path._4_4_],"--disable_conversions"), iVar3 == 0)) {
        i = 0;
      }
      else {
        iVar3 = strcmp(argv[definition_path._4_4_],"-p");
        if (((iVar3 != 0) || (argc <= definition_path._4_4_ + 1)) ||
           (*argv[definition_path._4_4_ + 1] == '-')) {
          if (*argv[definition_path._4_4_] == '-') {
            fprintf(_stderr,"ERROR: invalid arguments\n");
            print_help();
            exit(1);
          }
          goto LAB_00101819;
        }
        iVar3 = coda_expression_from_string(argv[definition_path._4_4_ + 1],&node_expr);
        pFVar2 = _stderr;
        if (iVar3 != 0) {
          puVar5 = (undefined4 *)coda_get_errno();
          uVar6 = coda_errno_to_string(*puVar5);
          fprintf(pFVar2,"ERROR: error in path expression: %s\n",uVar6);
          exit(1);
        }
        definition_path._4_4_ = definition_path._4_4_ + 1;
      }
    }
    definition_path._4_4_ = definition_path._4_4_ + 1;
  } while( true );
}

Assistant:

int main(int argc, char *argv[])
{
    int perform_conversions;
    int check_only;
    int i;

    perform_conversions = 1;
    check_only = 0;

    if (argc == 1 || strcmp(argv[1], "-h") == 0 || strcmp(argv[1], "--help") == 0)
    {
        print_help();
        exit(0);
    }

    if (strcmp(argv[1], "-v") == 0 || strcmp(argv[1], "--version") == 0)
    {
        print_version();
        exit(0);
    }

    i = 1;
    if (i + 1 < argc && strcmp(argv[i], "-D") == 0)
    {
        coda_set_definition_path(argv[i + 1]);
        i += 2;
    }
    else
    {
        const char *definition_path = "../share/" PACKAGE "/definitions";

        if (coda_set_definition_path_conditional(argv[0], NULL, definition_path) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    while (i < argc)
    {
        if (strcmp(argv[i], "-c") == 0 || strcmp(argv[i], "--check") == 0)
        {
            check_only = 1;
        }
        else if (strcmp(argv[i], "-d") == 0 || strcmp(argv[i], "--disable_conversions") == 0)
        {
            perform_conversions = 0;
        }
        else if (strcmp(argv[i], "-p") == 0 && i + 1 < argc && argv[i + 1][0] != '-')
        {
            if (coda_expression_from_string(argv[i + 1], &node_expr))
            {
                fprintf(stderr, "ERROR: error in path expression: %s\n", coda_errno_to_string(coda_errno));
                exit(1);
            }
            i++;
        }
        else if (argv[i][0] != '-')
        {
            /* assume all arguments from here on are the expression and the optional list of files/directories */
            break;
        }
        else
        {
            fprintf(stderr, "ERROR: invalid arguments\n");
            print_help();
            exit(1);
        }
        i++;
    }

    /* expression parameter */
    if (i >= argc)
    {
        fprintf(stderr, "ERROR: invalid arguments\n");
        print_help();
        exit(1);
    }
    if (coda_expression_from_string(argv[i], &eval_expr) != 0)
    {
        fprintf(stderr, "ERROR: error in expression: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    i++;

    if (coda_expression_get_type(eval_expr, &expr_type) != 0)
    {
        fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
        exit(1);
    }
    if (expr_type == coda_expression_node || expr_type == coda_expression_void)
    {
        fprintf(stderr, "ERROR: expression cannot be a '%s' expression\n", coda_expression_get_type_name(expr_type));
        exit(1);
    }

    if (check_only)
    {
        coda_expression_delete(eval_expr);
        if (node_expr != NULL)
        {
            coda_expression_delete(node_expr);
        }

        return 0;
    }

    if (i < argc)
    {
        if (coda_init() != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }

        coda_set_option_perform_conversions(perform_conversions);

        if (coda_match_filefilter(NULL, argc - i, (const char **)&argv[i], &callback, NULL) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }

        coda_done();
    }
    else
    {
        if (node_expr != NULL)
        {
            fprintf(stderr, "ERROR: invalid arguments (path expression is only allowed if a file/directory list is "
                    "provided)\n");
            exit(1);
        }
        if (!coda_expression_is_constant(eval_expr))
        {
            fprintf(stderr, "ERROR: invalid arguments (file/directory list needs to be provided if expression is not "
                    "a constant expression)\n");
            exit(1);
        }
        if (eval_expression(NULL) != 0)
        {
            fprintf(stderr, "ERROR: %s\n", coda_errno_to_string(coda_errno));
            exit(1);
        }
    }

    coda_expression_delete(eval_expr);
    if (node_expr != NULL)
    {
        coda_expression_delete(node_expr);
    }

    return 0;
}